

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t hd_strlcat(char *dst,char *src,size_t siz)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  
  pcVar6 = dst;
  if (siz != 0 && *dst != '\0') {
    lVar3 = siz - 1;
    do {
      bVar8 = lVar3 != 0;
      lVar3 = lVar3 + -1;
      pcVar4 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
      if (*pcVar4 == '\0') break;
    } while (bVar8);
  }
  lVar7 = (long)pcVar6 - (long)dst;
  lVar3 = siz - lVar7;
  if (lVar3 == 0) {
    sVar5 = strlen(src);
  }
  else {
    cVar2 = *src;
    pcVar4 = src;
    while (cVar2 != '\0') {
      if (lVar3 == 1) {
        lVar3 = 1;
      }
      else {
        *pcVar6 = cVar2;
        pcVar6 = pcVar6 + 1;
        lVar3 = lVar3 + -1;
      }
      pcVar1 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
      cVar2 = *pcVar1;
    }
    *pcVar6 = '\0';
    sVar5 = (long)pcVar4 - (long)src;
  }
  return sVar5 + lVar7;
}

Assistant:

size_t
hd_strlcat(char *dst, const char *src, size_t siz)
{
	register char *d = dst;
	register const char *s = src;
	register size_t n = siz;
	size_t dlen;

	/* Find the end of dst and adjust bytes left but don't go past end */
	while (*d != '\0' && n-- != 0)
		d++;
	dlen = d - dst;
	n = siz - dlen;

	if (n == 0)
		return dlen + strlen(s);
	while (*s != '\0') {
		if (n != 1) {
			*d++ = *s;
			n--;
		}
		s++;
	}
	*d = '\0';

	return dlen + (s - src);	/* count does not include NUL */
}